

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

MIR_reg_t get_new_ssa_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,int sep,int new_p)

{
  gen_ctx *pgVar1;
  void **ppvVar2;
  code *pcVar3;
  undefined1 uVar4;
  byte bVar5;
  bitmap_el_t bVar6;
  VARR_char *pVVar7;
  MIR_context_t ctx;
  FILE *__stream;
  MIR_func_t func;
  MIR_type_t type;
  MIR_reg_t MVar8;
  MIR_reg_t extraout_EAX;
  gen_ctx_t pgVar9;
  long *hard_reg_name;
  gen_ctx_t __s;
  bitmap_el_t *pbVar10;
  gen_ctx_t pgVar11;
  size_t sVar12;
  c2mir_ctx *pcVar13;
  MIR_item_t pMVar14;
  bitmap_t pVVar15;
  undefined1 *puVar16;
  char *pcVar17;
  char *pcVar18;
  int iVar19;
  gen_ctx *pgVar20;
  uint extraout_EDX;
  gen_ctx_t pgVar21;
  gen_ctx_t unaff_RBX;
  gen_ctx_t unaff_RBP;
  undefined4 in_register_00000034;
  gen_ctx_t nb;
  gen_ctx_t __ptr;
  long *in_R8;
  undefined8 in_R9;
  bitmap_t pVVar22;
  uint uVar23;
  gen_ctx_t unaff_R13;
  gen_ctx_t unaff_R15;
  
  nb = (gen_ctx_t)CONCAT44(in_register_00000034,reg);
  __s = (gen_ctx_t)(ulong)(uint)new_p;
  pgVar20 = (gen_ctx *)gen_ctx->ssa_ctx;
  pVVar22 = *(bitmap_t *)&pgVar20->addr_insn_p;
  __ptr = gen_ctx;
  if (pVVar22 != (bitmap_t)0x0) {
    unaff_R13 = (gen_ctx_t)(ulong)reg;
    unaff_R15 = (gen_ctx_t)(ulong)reg;
    do {
      pgVar21 = (gen_ctx_t)pVVar22->els_num;
      if (unaff_R15 < pgVar21) goto LAB_00161523;
      pgVar9 = (gen_ctx_t)pVVar22->varr;
      if (pgVar9 == (gen_ctx_t)0x0) {
        get_new_ssa_reg_cold_1();
        goto LAB_001617e2;
      }
      nb = (gen_ctx_t)((long)&pgVar21->ctx + 1);
      if ((gen_ctx_t)pVVar22->size <= pgVar21) {
        unaff_RBP = (gen_ctx_t)((long)nb->call_used_hard_regs + (((ulong)nb >> 1) - 0x68));
        __ptr = pgVar9;
        pgVar9 = (gen_ctx_t)realloc(pgVar9,(long)unaff_RBP * 8);
        pVVar22->varr = (bitmap_el_t *)pgVar9;
        pVVar22->size = (size_t)unaff_RBP;
        pgVar21 = (gen_ctx_t)pVVar22->els_num;
        pgVar20 = (gen_ctx *)gen_ctx->ssa_ctx;
        nb = (gen_ctx_t)((long)&pgVar21->ctx + 1);
      }
      pVVar22->els_num = (size_t)nb;
      pgVar9->call_used_hard_regs[(long)((long)&pgVar21[-1].spot2attr + 3)] = (bitmap_t)0x0;
      pVVar22 = *(bitmap_t *)&pgVar20->addr_insn_p;
      unaff_RBX = gen_ctx;
    } while (pVVar22 != (bitmap_t)0x0);
  }
  gen_ctx = unaff_RBX;
  get_new_ssa_reg_cold_9();
LAB_00161523:
  pbVar10 = pVVar22->varr;
  if (pbVar10 == (bitmap_el_t *)0x0) {
LAB_001617e2:
    get_new_ssa_reg_cold_8();
LAB_001617e7:
    get_new_ssa_reg_cold_7();
LAB_001617ec:
    get_new_ssa_reg_cold_5();
LAB_001617f1:
    hard_reg_name = in_R8;
    pgVar21 = __ptr;
    iVar19 = (int)pgVar20;
    get_new_ssa_reg_cold_6();
LAB_001617f6:
    get_new_ssa_reg_cold_3();
LAB_001617fb:
    get_new_ssa_reg_cold_2();
  }
  else {
    bVar6 = pbVar10[(long)unaff_R15];
    pbVar10[(long)unaff_R15] = bVar6 + 1;
    if ((new_p == 0) && (bVar6 == 0)) {
      return 0xffffffff;
    }
    pgVar21 = (gen_ctx_t)gen_ctx->ctx;
    uVar23 = (int)unaff_R13 - 0x21;
    unaff_R13 = (gen_ctx_t)(ulong)uVar23;
    pgVar9 = (gen_ctx_t)(gen_ctx->curr_func_item->u).func;
    type = MIR_reg_type((MIR_context_t)pgVar21,uVar23,(MIR_func_t)pgVar9);
    unaff_RBP = (gen_ctx_t)MIR_reg_name((MIR_context_t)pgVar21,uVar23,(MIR_func_t)pgVar9);
    nb = unaff_R13;
    __ptr = pgVar21;
    hard_reg_name = (long *)MIR_reg_hard_reg_name((MIR_context_t)pgVar21,uVar23,(MIR_func_t)pgVar9);
    pgVar20 = (gen_ctx *)gen_ctx->ssa_ctx;
    pVVar22 = pgVar20->tied_regs;
    __s = pgVar9;
    unaff_R15 = pgVar21;
    if ((pVVar22 == (bitmap_t)0x0) ||
       (unaff_R13 = (gen_ctx_t)pVVar22->varr, unaff_R13 == (gen_ctx_t)0x0)) goto LAB_001617e7;
    pVVar22->els_num = 0;
    __ptr = unaff_RBP;
    __s = (gen_ctx_t)strlen((char *)unaff_RBP);
    if ((gen_ctx_t)pVVar22->size < __s) {
      unaff_R15 = (gen_ctx_t)((long)__s->call_used_hard_regs + (((ulong)__s >> 1) - 0x68));
      pbVar10 = (bitmap_el_t *)realloc(unaff_R13,(size_t)unaff_R15);
      pVVar22->varr = pbVar10;
      pVVar22->size = (size_t)unaff_R15;
      __ptr = unaff_R13;
LAB_0016160a:
      pgVar11 = (gen_ctx_t)0x0;
      do {
        pgVar20 = (gen_ctx *)pVVar22->els_num;
        puVar16 = (undefined1 *)((long)&pgVar20->ctx + 1);
        pVVar22->els_num = (size_t)puVar16;
        uVar4 = *(undefined1 *)
                 ((long)pgVar11->call_used_hard_regs +
                 (long)(unaff_RBP->call_used_hard_regs + -0xd) + -0x68);
        nb = (gen_ctx_t)CONCAT71((int7)((ulong)puVar16 >> 8),uVar4);
        pgVar11 = (gen_ctx_t)((long)&pgVar11->ctx + 1);
        *(undefined1 *)((long)pVVar22->varr + (long)pgVar20) = uVar4;
      } while (__s != pgVar11);
      pVVar22 = (bitmap_t)gen_ctx->ssa_ctx->reg_name;
      unaff_R13 = (gen_ctx_t)pVVar22->varr;
      if (unaff_R13 != (gen_ctx_t)0x0) {
        pgVar20 = (gen_ctx *)pVVar22->els_num;
        puVar16 = (undefined1 *)((long)&pgVar20->ctx + 1);
        goto LAB_0016164f;
      }
      goto LAB_001617f1;
    }
    if (__s != (gen_ctx_t)0x0) goto LAB_0016160a;
    puVar16 = &DAT_00000001;
    pgVar20 = (gen_ctx *)0x0;
LAB_0016164f:
    if ((undefined1 *)pVVar22->size < puVar16) {
      unaff_R13 = (gen_ctx_t)realloc(unaff_R13,(size_t)(puVar16 + ((ulong)puVar16 >> 1)));
      pVVar22->varr = (bitmap_el_t *)unaff_R13;
      pVVar22->size = (size_t)(puVar16 + ((ulong)puVar16 >> 1));
      pgVar20 = (gen_ctx *)pVVar22->els_num;
      puVar16 = (undefined1 *)((long)&pgVar20->ctx + 1);
    }
    pVVar22->els_num = (size_t)puVar16;
    __s = (gen_ctx_t)&stack0xffffffffffffffa8;
    *(char *)((long)pgVar20->call_used_hard_regs +
             (long)(unaff_R13->call_used_hard_regs + -0xd) + -0x68) = (char)sep;
    nb = (gen_ctx_t)0x1b966c;
    sprintf((char *)__s,"%lu",bVar6);
    unaff_R15 = (gen_ctx_t)gen_ctx->ssa_ctx->reg_name;
    sVar12 = strlen((char *)__s);
    __ptr = (gen_ctx_t)unaff_R15->curr_func_item;
    if (__ptr == (gen_ctx_t)0x0) goto LAB_001617ec;
    pVVar22 = (bitmap_t)(sVar12 + 1);
    pcVar13 = (c2mir_ctx *)((long)&pVVar22->els_num + (long)unaff_R15->ctx);
    if (*(c2mir_ctx **)&unaff_R15->optimize_level < pcVar13) {
      __s = (gen_ctx_t)(pcVar13 + ((ulong)pcVar13 >> 1));
      nb = __s;
      pMVar14 = (MIR_item_t)realloc(__ptr,(size_t)__s);
      unaff_R15->curr_func_item = pMVar14;
      *(gen_ctx_t *)&unaff_R15->optimize_level = __s;
    }
    if (pVVar22 != (bitmap_t)0x0) {
      pVVar15 = (bitmap_t)0x0;
      do {
        pgVar20 = (gen_ctx *)unaff_R15->ctx;
        pgVar1 = (gen_ctx *)((long)&pgVar20->ctx + 1);
        unaff_R15->ctx = (MIR_context_t)pgVar1;
        pcVar3 = (code *)(&stack0xffffffffffffffa8 + (long)pVVar15);
        nb = (gen_ctx_t)CONCAT71((int7)((ulong)pgVar1 >> 8),*pcVar3);
        pVVar15 = (bitmap_t)((long)&pVVar15->els_num + 1);
        *(code *)((long)&pgVar20->ctx + (long)&unaff_R15->curr_func_item->data) = *pcVar3;
      } while (pVVar22 != pVVar15);
    }
    iVar19 = (int)pgVar20;
    pVVar7 = gen_ctx->ssa_ctx->reg_name;
    if (hard_reg_name != (long *)0x0) {
      if (pVVar7 == (VARR_char *)0x0) goto LAB_001617f6;
      pcVar17 = pVVar7->varr;
      MVar8 = MIR_new_global_func_reg
                        ((MIR_context_t)pgVar21,(MIR_func_t)pgVar9,type,pcVar17,
                         (char *)hard_reg_name);
      iVar19 = (int)pcVar17;
      unaff_R15 = (gen_ctx_t)gen_ctx->tied_regs;
      uVar23 = MVar8 + 0x21;
      __s = (gen_ctx_t)(ulong)uVar23;
      nb = (gen_ctx_t)((long)&__s->ctx + 1);
      pgVar21 = unaff_R15;
      bitmap_expand((bitmap_t)unaff_R15,(size_t)nb);
      if (unaff_R15 != (gen_ctx_t)0x0) {
        ppvVar2 = &unaff_R15->curr_func_item->data + (uVar23 >> 6);
        *ppvVar2 = (void *)((ulong)*ppvVar2 | 1L << ((ulong)__s & 0x3f));
        goto LAB_001617aa;
      }
      goto LAB_001617fb;
    }
    if (pVVar7 != (VARR_char *)0x0) {
      MVar8 = MIR_new_func_reg((MIR_context_t)pgVar21,(MIR_func_t)pgVar9,type,pVVar7->varr);
      uVar23 = MVar8 + 0x21;
LAB_001617aa:
      if ((uVar23 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar23)) {
        gen_ctx->curr_cfg->max_var = uVar23;
      }
      return uVar23;
    }
  }
  get_new_ssa_reg_cold_4();
  if (extraout_EDX < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5d8,
                  "void rename_op_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_insn_t, int)"
                 );
  }
  ctx = pgVar21->ctx;
  bVar5 = *(byte *)&nb->optimize_level;
  if (bVar5 == 0xb) {
    if (nb->debug_level == extraout_EDX) {
      nb->debug_level = iVar19;
      if (*(uint *)&nb->field_0x24 != extraout_EDX) goto LAB_0016185e;
    }
    else if (*(uint *)&nb->field_0x24 != extraout_EDX) goto LAB_001618d4;
    *(int *)&nb->field_0x24 = iVar19;
  }
  else {
    if ((bVar5 != 2) || (*(uint *)&nb->curr_func_item != extraout_EDX)) goto LAB_001618d4;
    *(int *)&nb->curr_func_item = iVar19;
  }
LAB_0016185e:
  __stream = (FILE *)pgVar21->debug_file;
  if ((__stream != (FILE *)0x0) && (1 < pgVar21->debug_level)) {
    func = (pgVar21->curr_func_item->u).func;
    pcVar17 = MIR_reg_name(ctx,extraout_EDX - 0x21,func);
    pcVar18 = MIR_reg_name(ctx,iVar19 - 0x21,func);
    fprintf(__stream,"    Change %s to %s in insn %-5lu",pcVar17,pcVar18,
            (ulong)*(uint *)(*hard_reg_name + 0xc),in_R9,pcVar17,gen_ctx,pVVar22,unaff_R13,__s,
            unaff_R15,unaff_RBP);
    print_bb_insn(pgVar21,(bb_insn_t_conflict)*hard_reg_name,0);
    return extraout_EAX;
  }
LAB_001618d4:
  return (MIR_reg_t)bVar5;
}

Assistant:

static MIR_reg_t get_new_ssa_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, int sep, int new_p) {
  size_t reg_index;

  while (VARR_LENGTH (size_t, curr_reg_indexes) <= reg) VARR_PUSH (size_t, curr_reg_indexes, 0);
  reg_index = VARR_GET (size_t, curr_reg_indexes, reg);
  VARR_SET (size_t, curr_reg_indexes, reg, reg_index + 1);
  return reg_index == 0 && !new_p ? MIR_NON_VAR : get_new_reg (gen_ctx, reg, sep, reg_index);
}